

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O3

string * limonp::Trim(string *s)

{
  pointer pcVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  size_type sVar6;
  pointer pcVar7;
  long lVar8;
  char *pcVar9;
  size_type sVar10;
  pointer pcVar11;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar6 = s->_M_string_length;
  sVar10 = sVar6;
  if (0 < (long)sVar6 >> 2) {
    sVar10 = (size_type)((uint)sVar6 & 3);
    lVar8 = ((long)sVar6 >> 2) + 1;
    do {
      if ((pcVar1[sVar6 - 1] < '\0') || (iVar5 = isspace((int)pcVar1[sVar6 - 1]), iVar5 == 0)) {
        pcVar7 = pcVar1 + sVar6;
        goto LAB_00114e3c;
      }
      if ((pcVar1[sVar6 - 2] < '\0') || (iVar5 = isspace((int)pcVar1[sVar6 - 2]), iVar5 == 0)) {
        pcVar7 = pcVar1 + (sVar6 - 1);
        goto LAB_00114e3c;
      }
      if ((pcVar1[sVar6 - 3] < '\0') || (iVar5 = isspace((int)pcVar1[sVar6 - 3]), iVar5 == 0)) {
        pcVar7 = pcVar1 + (sVar6 - 2);
        goto LAB_00114e3c;
      }
      if ((pcVar1[sVar6 - 4] < '\0') || (iVar5 = isspace((int)pcVar1[sVar6 - 4]), iVar5 == 0)) {
        pcVar7 = pcVar1 + (sVar6 - 3);
        goto LAB_00114e3c;
      }
      sVar6 = sVar6 - 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  pcVar11 = pcVar1 + sVar10;
  lVar8 = (long)pcVar11 - (long)pcVar1;
  if (lVar8 == 1) {
LAB_00114e06:
    pcVar7 = pcVar11;
    if ((-1 < pcVar11[-1]) && (iVar5 = isspace((int)pcVar11[-1]), iVar5 != 0)) {
      pcVar7 = pcVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_00114df1:
    pcVar7 = pcVar11;
    if ((-1 < pcVar11[-1]) && (iVar5 = isspace((int)pcVar11[-1]), iVar5 != 0)) {
      pcVar11 = pcVar11 + -1;
      goto LAB_00114e06;
    }
  }
  else {
    pcVar7 = pcVar1;
    if (((lVar8 == 3) && (pcVar7 = pcVar11, -1 < pcVar11[-1])) &&
       (iVar5 = isspace((int)pcVar11[-1]), iVar5 != 0)) {
      pcVar11 = pcVar11 + -1;
      goto LAB_00114df1;
    }
  }
LAB_00114e3c:
  s->_M_string_length = (long)pcVar7 - (long)pcVar1;
  *pcVar7 = '\0';
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pcVar4 = pcVar2;
  if (0 < (long)uVar3 >> 2) {
    lVar8 = ((long)uVar3 >> 2) + 1;
    pcVar9 = pcVar2 + 3;
    do {
      if ((pcVar9[-3] < '\0') || (iVar5 = isspace((int)pcVar9[-3]), iVar5 == 0)) {
        pcVar9 = pcVar9 + -3;
        goto LAB_00114f44;
      }
      if ((pcVar9[-2] < '\0') || (iVar5 = isspace((int)pcVar9[-2]), iVar5 == 0)) {
        pcVar9 = pcVar9 + -2;
        goto LAB_00114f44;
      }
      if ((pcVar9[-1] < '\0') || (iVar5 = isspace((int)pcVar9[-1]), iVar5 == 0)) {
        pcVar9 = pcVar9 + -1;
        goto LAB_00114f44;
      }
      if ((*pcVar9 < '\0') || (iVar5 = isspace((int)*pcVar9), iVar5 == 0)) goto LAB_00114f44;
      lVar8 = lVar8 + -1;
      pcVar9 = pcVar9 + 4;
      pcVar4 = pcVar2 + (uVar3 & 0xfffffffffffffffc);
    } while (1 < lVar8);
  }
  pcVar9 = pcVar4;
  lVar8 = (long)(pcVar2 + uVar3) - (long)pcVar9;
  if (lVar8 == 1) {
LAB_00114f1f:
    if ((-1 < *pcVar9) && (iVar5 = isspace((int)*pcVar9), iVar5 != 0)) goto LAB_00114f5b;
  }
  else if (lVar8 == 2) {
LAB_00114f0b:
    if ((-1 < *pcVar9) && (iVar5 = isspace((int)*pcVar9), iVar5 != 0)) {
      pcVar9 = pcVar9 + 1;
      goto LAB_00114f1f;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_00114f5b;
    if ((-1 < *pcVar9) && (iVar5 = isspace((int)*pcVar9), iVar5 != 0)) {
      pcVar9 = pcVar9 + 1;
      goto LAB_00114f0b;
    }
  }
LAB_00114f44:
  if (pcVar2 + uVar3 != pcVar9) {
    std::__cxx11::string::_M_erase((ulong)s,0);
    return s;
  }
LAB_00114f5b:
  s->_M_string_length = 0;
  *pcVar2 = '\0';
  return s;
}

Assistant:

inline std::string& Trim(std::string &s) {
  return LTrim(RTrim(s));
}